

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::GetNode
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this,int key)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = this->Nodes + (this->Size - 1 & key);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key == key) {
LAB_00465627:
      if (pNVar2 == (Node *)0x0) {
        pNVar2 = NewKey(this,key);
        (pNVar2->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Array = (FUDMFKey *)0x0;
        (pNVar2->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Most = 0;
        (pNVar2->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count = 0;
        (pNVar2->Pair).Value.mSorted = false;
      }
      return pNVar2;
    }
  }
  pNVar2 = (Node *)0x0;
  goto LAB_00465627;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}